

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MutablePriorityQueue.h
# Opt level: O0

void __thiscall
MutablePriorityQueue<Vertex<std::pair<double,_double>_>_>::heapifyDown
          (MutablePriorityQueue<Vertex<std::pair<double,_double>_>_> *this,uint i)

{
  Vertex<std::pair<double,_double>_> *rhs;
  Vertex<std::pair<double,_double>_> *this_00;
  bool bVar1;
  reference ppVVar2;
  size_type sVar3;
  uint local_24;
  uint k;
  value_type x;
  uint i_local;
  MutablePriorityQueue<Vertex<std::pair<double,_double>_>_> *this_local;
  
  ppVVar2 = std::
            vector<Vertex<std::pair<double,_double>_>_*,_std::allocator<Vertex<std::pair<double,_double>_>_*>_>
            ::operator[](&this->H,(ulong)i);
  rhs = *ppVVar2;
  x._4_4_ = i;
  while( true ) {
    local_24 = x._4_4_ * 2;
    sVar3 = std::
            vector<Vertex<std::pair<double,_double>_>_*,_std::allocator<Vertex<std::pair<double,_double>_>_*>_>
            ::size(&this->H);
    if (sVar3 <= local_24) break;
    sVar3 = std::
            vector<Vertex<std::pair<double,_double>_>_*,_std::allocator<Vertex<std::pair<double,_double>_>_*>_>
            ::size(&this->H);
    if (local_24 + 1 < sVar3) {
      ppVVar2 = std::
                vector<Vertex<std::pair<double,_double>_>_*,_std::allocator<Vertex<std::pair<double,_double>_>_*>_>
                ::operator[](&this->H,(ulong)(local_24 + 1));
      this_00 = *ppVVar2;
      ppVVar2 = std::
                vector<Vertex<std::pair<double,_double>_>_*,_std::allocator<Vertex<std::pair<double,_double>_>_*>_>
                ::operator[](&this->H,(ulong)local_24);
      bVar1 = Vertex<std::pair<double,_double>_>::compare(this_00,*ppVVar2,(bool)(this->inv & 1));
      if (bVar1) {
        local_24 = local_24 + 1;
      }
    }
    ppVVar2 = std::
              vector<Vertex<std::pair<double,_double>_>_*,_std::allocator<Vertex<std::pair<double,_double>_>_*>_>
              ::operator[](&this->H,(ulong)local_24);
    bVar1 = Vertex<std::pair<double,_double>_>::compare(*ppVVar2,rhs,(bool)(this->inv & 1));
    if (!bVar1) break;
    ppVVar2 = std::
              vector<Vertex<std::pair<double,_double>_>_*,_std::allocator<Vertex<std::pair<double,_double>_>_*>_>
              ::operator[](&this->H,(ulong)local_24);
    set(this,x._4_4_,*ppVVar2);
    x._4_4_ = local_24;
  }
  set(this,x._4_4_,rhs);
  return;
}

Assistant:

void MutablePriorityQueue<T>::heapifyDown(unsigned i) {
	auto x = H[i];
	while (true) {
		unsigned k = leftChild(i);
		if (k >= H.size())
			break;
		if (k+1 < H.size() && (*H[k+1]).compare(*H[k], inv))
			++k; // right child of i
		if ( ! ((*H[k]).compare(*x, inv)) )
			break;
		set(i, H[k]);
		i = k;
	}
	set(i, x);
}